

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::updateSurpluses<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,MultiIndexSet *work,int max_level,
          vector<int,_std::allocator<int>_> *level,Data2D<int> *dagUp)

{
  vector<int,std::allocator<int>> *this_00;
  int iVar1;
  int iVar2;
  iterator __position;
  pointer piVar3;
  pointer piVar4;
  size_t sVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong *puVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  ulong *puVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  GridLocalPolynomial *this_01;
  int iVar18;
  ulong uVar19;
  size_type __n;
  ulong uVar20;
  double dVar21;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<double,_std::allocator<double>_> x;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  indexses_for_levels;
  bool local_119;
  GridLocalPolynomial *local_118;
  int local_110;
  allocator_type local_109;
  ulong local_108;
  undefined8 local_100;
  undefined4 local_f8;
  ulong *local_f0;
  int local_e8;
  long local_e0;
  MultiIndexSet *local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<int,_std::allocator<int>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  size_type local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  Data2D<int> *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  iVar18 = work->cache_num_indexes;
  __n = (size_type)iVar18;
  local_110 = (this->super_BaseCanonicalGrid).num_dimensions;
  local_118 = this;
  local_d8 = work;
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,(long)max_level + 1,(allocator_type *)&local_100);
  local_100 = (ulong *)((ulong)local_100._4_4_ << 0x20);
  if (0 < (long)__n) {
    iVar9 = 0;
    do {
      lVar11 = (long)(level->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar9];
      if (0 < lVar11) {
        this_00 = (vector<int,std::allocator<int>> *)
                  (local_48.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar11);
        __position._M_current = *(int **)(this_00 + 8);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position,(int *)&local_100);
        }
        else {
          *__position._M_current = iVar9;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
      }
      iVar9 = (int)local_100 + 1;
      local_100 = (ulong *)CONCAT44(local_100._4_4_,iVar9);
    } while (iVar9 < iVar18);
  }
  if (0 < max_level) {
    uVar19 = (ulong)(max_level + 1);
    uVar20 = 1;
    this_01 = local_118;
    local_88 = __n;
    local_80 = uVar19;
    local_68 = dagUp;
    do {
      local_70 = uVar20 * 3;
      piVar3 = local_48.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar20].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar4 = local_48.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar20].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      ::std::vector<double,_std::allocator<double>_>::vector
                (&local_a0,(long)(this_01->super_BaseCanonicalGrid).num_dimensions,
                 (allocator_type *)&local_100);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_b8,uVar19,(allocator_type *)&local_100);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_d0,uVar19,(allocator_type *)&local_100);
      local_119 = false;
      local_78 = uVar20;
      ::std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_100,__n,&local_119,&local_109);
      local_108 = (ulong)((long)piVar3 - (long)piVar4) >> 2;
      this_01 = local_118;
      if (0 < (int)(uint)local_108) {
        local_108 = (ulong)((uint)local_108 & 0x7fffffff);
        uVar19 = 0;
        iVar18 = local_110;
        do {
          iVar2 = local_e8;
          puVar8 = local_f0;
          iVar9 = (&((local_48.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start)[local_70][uVar19];
          lVar11 = (long)(this_01->super_BaseCanonicalGrid).num_dimensions;
          if (0 < lVar11) {
            sVar5 = local_d8->num_dimensions;
            piVar3 = (local_d8->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar15 = 0;
            do {
              iVar1 = piVar3[sVar5 * (long)iVar9 + lVar15];
              uVar16 = iVar1 + 1;
              dVar21 = 1.0;
              if (1 < uVar16) {
                iVar17 = 1;
                do {
                  uVar16 = (int)uVar16 >> 1;
                  iVar17 = iVar17 * 2;
                } while (1 < uVar16);
                dVar21 = (double)iVar17;
              }
              local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15] = (double)(iVar1 * 2 + 3) / dVar21 + -3.0;
              lVar15 = lVar15 + 1;
            } while (lVar15 != lVar11);
          }
          puVar14 = local_100;
          local_60 = uVar19;
          if (local_100 != local_f0) {
            memset(local_100,0,(long)local_f0 - (long)local_100);
            puVar14 = puVar8;
            this_01 = local_118;
            iVar18 = local_110;
          }
          if (iVar2 != 0) {
            *puVar14 = *puVar14 & ~(0xffffffffffffffffU >> (-(char)iVar2 & 0x3fU));
          }
          lVar11 = (this_01->surpluses).stride * (long)iVar9;
          pdVar6 = (this_01->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start = 0;
          *local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start = iVar9;
          if (*local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start < iVar18) {
            iVar9 = 0;
            piVar10 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar13 = local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              iVar2 = piVar10[iVar9];
              if (iVar2 < iVar18) {
                iVar1 = (dagUp->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [(long)piVar13[iVar9] * dagUp->stride + (long)iVar2];
                uVar19 = (ulong)iVar1;
                if (uVar19 != 0xffffffffffffffff) {
                  iVar17 = iVar1 + 0x3f;
                  if (-1 < iVar1) {
                    iVar17 = iVar1;
                  }
                  uVar20 = (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001);
                  if ((local_100[(long)(iVar17 >> 6) + (uVar20 - 1)] >> (uVar19 & 0x3f) & 1) == 0) {
                    sVar5 = (this_01->surpluses).stride;
                    pdVar7 = (this_01->surpluses).vec.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    local_58 = 1L << ((byte)iVar1 & 0x3f);
                    local_50 = uVar20;
                    dVar21 = evalBasisRaw<(TasGrid::RuleLocal::erule)3>
                                       (this_01,(local_d8->indexes).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start +
                                                uVar19 * local_d8->num_dimensions,
                                        local_a0.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    lVar15 = (long)(this_01->super_BaseCanonicalGrid).num_outputs;
                    if (0 < lVar15) {
                      lVar12 = 0;
                      do {
                        pdVar6[lVar11 + lVar12] =
                             pdVar7[sVar5 * uVar19 + lVar12] * -dVar21 + pdVar6[lVar11 + lVar12];
                        lVar12 = lVar12 + 1;
                      } while (lVar15 != lVar12);
                    }
                    local_100[(long)(iVar17 >> 6) + (local_50 - 1)] =
                         local_100[(long)(iVar17 >> 6) + (local_50 - 1)] | local_58;
                    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)iVar9 + 1] = 0;
                    local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)iVar9 + 1] = iVar1;
                    piVar10 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    piVar13 = local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    dagUp = local_68;
                    iVar18 = local_110;
                    iVar9 = iVar9 + 1;
                    goto LAB_00192e6b;
                  }
                }
                piVar10[iVar9] = iVar2 + 1;
              }
              else {
                piVar10[(long)iVar9 + -1] = piVar10[(long)iVar9 + -1] + 1;
                iVar9 = iVar9 + -1;
              }
LAB_00192e6b:
            } while (*piVar10 < iVar18);
          }
          uVar19 = local_60 + 1;
        } while (uVar19 != local_108);
      }
      if (local_100 != (ulong *)0x0) {
        operator_delete(local_100,local_e0 - (long)local_100);
        local_100 = (ulong *)0x0;
        local_f8 = 0;
        this_01 = local_118;
      }
      uVar20 = local_78;
      uVar19 = local_80;
      __n = local_88;
      if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        this_01 = local_118;
      }
      if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        this_01 = local_118;
      }
      if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
        this_01 = local_118;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar19);
  }
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void GridLocalPolynomial::updateSurpluses(MultiIndexSet const &work, int max_level, std::vector<int> const &level, Data2D<int> const &dagUp){
    int num_points = work.getNumIndexes();
    int max_parents = num_dimensions * RuleLocal::getMaxNumParents<effrule>();

    std::vector<std::vector<int>> indexses_for_levels((size_t) max_level+1);
    for(int i=0; i<num_points; i++)
        if (level[i] > 0) indexses_for_levels[level[i]].push_back(i);

    for(int l=1; l<=max_level; l++){
        int level_size = (int) indexses_for_levels[l].size();
        #pragma omp parallel
        {
            std::vector<double> x(num_dimensions);

            std::vector<int> monkey_count(max_level + 1);
            std::vector<int> monkey_tail(max_level + 1);
            std::vector<bool> used(num_points, false);

            #pragma omp for schedule(dynamic)
            for(int s=0; s<level_size; s++){
                int i = indexses_for_levels[l][s];

                int const *pnt = work.getIndex(i);
                for(int j=0; j<num_dimensions; j++)
                    x[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                double *surpi = surpluses.getStrip(i);

                int current = 0;

                monkey_count[0] = 0;
                monkey_tail[0] = i;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || (used[branch])){
                            monkey_count[current]++;
                        }else{
                            const double *branch_surp = surpluses.getStrip(branch);
                            double basis_value = evalBasisRaw<effrule>(work.getIndex(branch), x.data());
                            for(int k=0; k<num_outputs; k++)
                                surpi[k] -= basis_value * branch_surp[k];
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            } // for-loop
        } // omp parallel
    } // level loop
}